

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_state.cpp
# Opt level: O3

void __thiscall
lzham::lzcompressor::state::start_of_block
          (state *this,search_accelerator *dict,uint cur_ofs,uint block_index)

{
  (this->super_state_base).m_match_hist[3] = 1;
  (this->super_state_base).m_cur_state = 0;
  (this->super_state_base).m_match_hist[0] = 1;
  (this->super_state_base).m_match_hist[1] = 1;
  (this->super_state_base).m_match_hist[2] = 1;
  (this->super_state_base).m_cur_ofs = cur_ofs;
  this->m_block_start_dict_ofs = cur_ofs;
  return;
}

Assistant:

void lzcompressor::state::reset_state_partial()
   {
      LZHAM_ASSUME(CLZBase::cMatchHistSize == 4);
      m_match_hist[0] = 1;
      m_match_hist[1] = 1;
      m_match_hist[2] = 1;
      m_match_hist[3] = 1;
      m_cur_state = 0;
   }